

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,cmDuration timeout,Encoding encoding)

{
  pointer pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  cmsysProcess *cp;
  char *pcVar5;
  ostream *poVar6;
  long lVar7;
  size_t length_00;
  vector<char,_std::allocator<char>_> *v;
  string *cmd;
  pointer pbVar8;
  bool bVar9;
  cmProcessOutput processOutput;
  int length;
  char *data;
  string *local_138;
  string strdata;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = (string *)timeout.__r;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&argv,((long)(command->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(command->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar1 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1) {
    strdata._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&strdata);
  }
  strdata._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&strdata);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (outputflag == OUTPUT_MERGE) {
LAB_00164c98:
    cmsysProcess_SetOption(cp,2,1);
LAB_00164ca8:
    bVar3 = false;
    captureStdErr = (string *)0x0;
  }
  else {
    if (outputflag == OUTPUT_PASSTHROUGH) {
      cmsysProcess_SetPipeShared(cp,2,1);
      cmsysProcess_SetPipeShared(cp,3,1);
      captureStdOut = (string *)0x0;
      goto LAB_00164ca8;
    }
    if (captureStdErr == (string *)0x0) goto LAB_00164ca8;
    bVar3 = true;
    if (captureStdErr == captureStdOut) goto LAB_00164c98;
  }
  cmsysProcess_SetTimeout(cp,(double)local_138);
  cmsysProcess_Execute(cp);
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  bVar2 = ~bVar3;
  if ((outputflag != OUTPUT_PASSTHROUGH) &&
     (!(bool)(outputflag == OUTPUT_NONE & captureStdOut == (string *)0x0 & bVar2))) {
    local_138 = captureStdErr;
LAB_00164d48:
    while (iVar4 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0),
          captureStdErr = local_138, 0 < iVar4) {
      for (lVar7 = 0; length_00 = (size_t)length, lVar7 < (long)length_00; lVar7 = lVar7 + 1) {
        if (data[lVar7] == '\0') {
          data[lVar7] = ' ';
        }
      }
      if (iVar4 == 2) goto LAB_00164dbb;
      if (iVar4 == 3) {
        if (outputflag != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&processOutput,data,length_00,&strdata,2);
          Stderr(&strdata);
        }
        v = &tempStdErr;
        if (bVar3) goto LAB_00164dee;
      }
    }
    if (outputflag != OUTPUT_NONE) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,1);
      std::__cxx11::string::~string((string *)&local_50);
      if (strdata._M_string_length != 0) {
        Stdout(&strdata);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,2);
      std::__cxx11::string::~string((string *)&local_70);
      if (strdata._M_string_length != 0) {
        Stderr(&strdata);
      }
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (captureStdOut != (string *)0x0) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdOut,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&local_90,(string *)captureStdOut);
    cmProcessOutput::DecodeText(&processOutput,&local_90,captureStdOut,0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (bVar3) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdErr,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&local_b0,(string *)captureStdErr);
    cmProcessOutput::DecodeText(&processOutput,&local_b0,captureStdErr,0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  iVar4 = cmsysProcess_GetState(cp);
  if (iVar4 == 4) {
    if (retVal == (int *)0x0) {
      iVar4 = cmsysProcess_GetExitValue(cp);
      bVar9 = iVar4 == 0;
    }
    else {
      iVar4 = cmsysProcess_GetExitValue(cp);
      *retVal = iVar4;
      bVar9 = true;
    }
  }
  else {
    iVar4 = cmsysProcess_GetState(cp);
    if (iVar4 == 2) {
      pcVar5 = cmsysProcess_GetExceptionString(cp);
      if (outputflag != OUTPUT_NONE) {
        poVar6 = std::operator<<((ostream *)&std::cerr,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      if (!(bool)(bVar2 & captureStdOut == (string *)0x0)) {
        if (bVar3) {
          captureStdOut = captureStdErr;
        }
        strlen(pcVar5);
        std::__cxx11::string::append((char *)captureStdOut,(ulong)pcVar5);
      }
    }
    else {
      iVar4 = cmsysProcess_GetState(cp);
      if (iVar4 == 1) {
        pcVar5 = cmsysProcess_GetErrorString(cp);
        if (outputflag != OUTPUT_NONE) {
          poVar6 = std::operator<<((ostream *)&std::cerr,pcVar5);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        if (!(bool)(bVar2 & captureStdOut == (string *)0x0)) {
          if (bVar3) {
            captureStdOut = captureStdErr;
          }
          strlen(pcVar5);
          std::__cxx11::string::append((char *)captureStdOut,(ulong)pcVar5);
        }
      }
      else {
        iVar4 = cmsysProcess_GetState(cp);
        bVar9 = true;
        if (iVar4 != 5) goto LAB_001650a7;
        if (outputflag != OUTPUT_NONE) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Process terminated due to timeout\n");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        if (bVar3) {
          std::__cxx11::string::append((char *)captureStdErr,0x56aa11);
        }
      }
    }
    bVar9 = false;
  }
LAB_001650a7:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdErr.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdOut.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return bVar9;
LAB_00164dbb:
  if (outputflag != OUTPUT_NONE) {
    cmProcessOutput::DecodeText(&processOutput,data,length_00,&strdata,1);
    Stdout(&strdata);
  }
  v = &tempStdOut;
  if (captureStdOut != (string *)0x0) {
LAB_00164dee:
    ::cm::append<std::vector<char,_std::allocator<char>_>,_char_*,_0>(v,data,data + length);
  }
  goto LAB_00164d48;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     cmDuration timeout, Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(command.size() + 1);
  for (std::string const& cmd : command) {
    argv.push_back(cmd.c_str());
  }
  argv.push_back(nullptr);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = nullptr;
    captureStdErr = nullptr;
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = nullptr;
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    while ((pipe = cmsysProcess_WaitForData(cp, &data, &length, nullptr)) >
           0) {
      // Translate NULL characters in the output into valid text.
      for (int i = 0; i < length; ++i) {
        if (data[i] == '\0') {
          data[i] = ' ';
        }
      }

      if (pipe == cmsysProcess_Pipe_STDOUT) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 1);
          cmSystemTools::Stdout(strdata);
        }
        if (captureStdOut) {
          cm::append(tempStdOut, data, data + length);
        }
      } else if (pipe == cmsysProcess_Pipe_STDERR) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 2);
          cmSystemTools::Stderr(strdata);
        }
        if (captureStdErr) {
          cm::append(tempStdErr, data, data + length);
        }
      }
    }

    if (outputflag != OUTPUT_NONE) {
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        cmSystemTools::Stdout(strdata);
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        cmSystemTools::Stderr(strdata);
      }
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << exception_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(exception_str, strlen(exception_str));
    } else if (captureStdOut) {
      captureStdOut->append(exception_str, strlen(exception_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    } else if (captureStdOut) {
      captureStdOut->append(error_str, strlen(error_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}